

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

CLBool * __thiscall CLBool::operator=(CLBool *this,string *other)

{
  stringstream sstream;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,(string *)other);
  std::istream::_M_extract<bool>((bool *)asStack_198);
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return this;
}

Assistant:

CLBool& operator=(std::string& other) {
        std::stringstream sstream ;
        sstream << other ;
        sstream >> value ;
        return *this ;
    }